

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_sse2.c
# Opt level: O2

void aom_highbd_filter_block1d8_h4_sse2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  short sVar1;
  short sVar9;
  short sVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 (*pauVar13) [16];
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  
  uVar11 = *(undefined4 *)(filter + 2);
  uVar12 = *(undefined4 *)(filter + 4);
  auVar15 = ZEXT416((uint)~(-1 << ((byte)bd & 0x1f)));
  auVar15 = pshuflw(auVar15,auVar15,0);
  auVar16._4_4_ = uVar12;
  auVar16._0_4_ = uVar12;
  auVar16._8_4_ = uVar12;
  auVar16._12_4_ = uVar12;
  pauVar13 = (undefined1 (*) [16])(src_ptr + 3);
  while (bVar14 = height != 0, height = height - 1, bVar14) {
    auVar20 = *(undefined1 (*) [16])(pauVar13[-1] + 8);
    auVar18 = *pauVar13;
    auVar24._0_8_ = auVar20._4_8_;
    auVar24._8_8_ = auVar18._4_8_;
    auVar17._4_4_ = uVar11;
    auVar17._0_4_ = uVar11;
    auVar17._8_4_ = uVar11;
    auVar17._12_4_ = uVar11;
    auVar22 = pmaddwd(auVar20,auVar17);
    auVar17 = pmaddwd(auVar24,auVar16);
    auVar23._0_8_ = auVar20._2_8_;
    auVar23._8_8_ = auVar18._2_8_;
    auVar19._0_8_ = auVar20._6_8_;
    auVar19._8_8_ = auVar18._6_8_;
    auVar20._4_4_ = uVar11;
    auVar20._0_4_ = uVar11;
    auVar20._8_4_ = uVar11;
    auVar20._12_4_ = uVar11;
    auVar24 = pmaddwd(auVar23,auVar20);
    auVar20 = pmaddwd(auVar19,auVar16);
    auVar21._0_4_ = auVar17._0_4_ + auVar22._0_4_ + 0x40 >> 7;
    auVar21._4_4_ = auVar20._0_4_ + auVar24._0_4_ + 0x40 >> 7;
    auVar21._8_4_ = auVar17._4_4_ + auVar22._4_4_ + 0x40 >> 7;
    auVar21._12_4_ = auVar20._4_4_ + auVar24._4_4_ + 0x40 >> 7;
    auVar18._0_4_ = auVar17._8_4_ + auVar22._8_4_ + 0x40 >> 7;
    auVar18._4_4_ = auVar20._8_4_ + auVar24._8_4_ + 0x40 >> 7;
    auVar18._8_4_ = auVar17._12_4_ + auVar22._12_4_ + 0x40 >> 7;
    auVar18._12_4_ = auVar20._12_4_ + auVar24._12_4_ + 0x40 >> 7;
    auVar20 = packssdw(auVar21,auVar18);
    sVar1 = (ushort)(-1 < auVar20._0_2_) * auVar20._0_2_;
    sVar2 = (ushort)(-1 < auVar20._2_2_) * auVar20._2_2_;
    sVar3 = (ushort)(-1 < auVar20._4_2_) * auVar20._4_2_;
    sVar4 = (ushort)(-1 < auVar20._6_2_) * auVar20._6_2_;
    sVar5 = (ushort)(-1 < auVar20._8_2_) * auVar20._8_2_;
    sVar6 = (ushort)(-1 < auVar20._10_2_) * auVar20._10_2_;
    sVar7 = (ushort)(-1 < auVar20._12_2_) * auVar20._12_2_;
    sVar8 = (ushort)(-1 < auVar20._14_2_) * auVar20._14_2_;
    sVar9 = auVar15._0_2_;
    sVar10 = auVar15._2_2_;
    *dst_ptr = (ushort)(sVar9 < sVar1) * sVar9 | (ushort)(sVar9 >= sVar1) * sVar1;
    dst_ptr[1] = (ushort)(sVar10 < sVar2) * sVar10 | (ushort)(sVar10 >= sVar2) * sVar2;
    dst_ptr[2] = (ushort)(sVar9 < sVar3) * sVar9 | (ushort)(sVar9 >= sVar3) * sVar3;
    dst_ptr[3] = (ushort)(sVar10 < sVar4) * sVar10 | (ushort)(sVar10 >= sVar4) * sVar4;
    dst_ptr[4] = (ushort)(sVar9 < sVar5) * sVar9 | (ushort)(sVar9 >= sVar5) * sVar5;
    dst_ptr[5] = (ushort)(sVar10 < sVar6) * sVar10 | (ushort)(sVar10 >= sVar6) * sVar6;
    dst_ptr[6] = (ushort)(sVar9 < sVar7) * sVar9 | (ushort)(sVar9 >= sVar7) * sVar7;
    dst_ptr[7] = (ushort)(sVar10 < sVar8) * sVar10 | (ushort)(sVar10 >= sVar8) * sVar8;
    dst_ptr = dst_ptr + dst_pitch;
    pauVar13 = (undefined1 (*) [16])(*pauVar13 + src_pitch * 2);
  }
  return;
}

Assistant:

static void aom_highbd_filter_block1d8_h4_sse2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  __m128i filtersReg;
  __m128i addFilterReg64;
  __m128i secondFilters, thirdFilters;
  __m128i srcRegFilt32b1_1, srcRegFilt32b1_2;
  __m128i srcReg32b1, srcReg32b2;
  unsigned int i;
  src_ptr -= 3;
  addFilterReg64 = _mm_set1_epi32(64);
  filtersReg = _mm_loadu_si128((const __m128i *)filter);
  const __m128i max = _mm_set1_epi16((1 << bd) - 1);

  // coeffs 0 1 0 1 2 3 2 3
  const __m128i tmp_0 = _mm_unpacklo_epi32(filtersReg, filtersReg);
  // coeffs 4 5 4 5 6 7 6 7
  const __m128i tmp_1 = _mm_unpackhi_epi32(filtersReg, filtersReg);

  secondFilters = _mm_unpackhi_epi64(tmp_0, tmp_0);  // coeffs 2 3 2 3 2 3 2 3
  thirdFilters = _mm_unpacklo_epi64(tmp_1, tmp_1);   // coeffs 4 5 4 5 4 5 4 5

  for (i = height; i > 0; i -= 1) {
    srcReg32b1 = _mm_loadu_si128((const __m128i *)(src_ptr + 2));
    srcReg32b2 = _mm_loadu_si128((const __m128i *)(src_ptr + 6));

    __m128i ss_4_1 = _mm_srli_si128(srcReg32b1, 4);
    __m128i ss_4_2 = _mm_srli_si128(srcReg32b2, 4);
    __m128i ss_4 = _mm_unpacklo_epi64(ss_4_1, ss_4_2);

    __m128i d1 = _mm_madd_epi16(srcReg32b1, secondFilters);
    __m128i d2 = _mm_madd_epi16(ss_4, thirdFilters);
    srcRegFilt32b1_1 = _mm_add_epi32(d1, d2);

    __m128i ss_3_1 = _mm_srli_si128(srcReg32b1, 2);
    __m128i ss_5_1 = _mm_srli_si128(srcReg32b1, 6);
    __m128i ss_3_2 = _mm_srli_si128(srcReg32b2, 2);
    __m128i ss_5_2 = _mm_srli_si128(srcReg32b2, 6);
    __m128i ss_3 = _mm_unpacklo_epi64(ss_3_1, ss_3_2);
    __m128i ss_5 = _mm_unpacklo_epi64(ss_5_1, ss_5_2);

    d1 = _mm_madd_epi16(ss_3, secondFilters);
    d2 = _mm_madd_epi16(ss_5, thirdFilters);
    srcRegFilt32b1_2 = _mm_add_epi32(d1, d2);

    __m128i res_lo_1 = _mm_unpacklo_epi32(srcRegFilt32b1_1, srcRegFilt32b1_2);
    __m128i res_hi_1 = _mm_unpackhi_epi32(srcRegFilt32b1_1, srcRegFilt32b1_2);

    // shift by 7 bit each 32 bit
    res_lo_1 = _mm_add_epi32(res_lo_1, addFilterReg64);
    res_hi_1 = _mm_add_epi32(res_hi_1, addFilterReg64);
    res_lo_1 = _mm_srai_epi32(res_lo_1, 7);
    res_hi_1 = _mm_srai_epi32(res_hi_1, 7);

    srcRegFilt32b1_1 = _mm_packs_epi32(res_lo_1, res_hi_1);

    srcRegFilt32b1_1 = _mm_max_epi16(srcRegFilt32b1_1, _mm_setzero_si128());
    srcRegFilt32b1_1 = _mm_min_epi16(srcRegFilt32b1_1, max);

    src_ptr += src_pitch;

    _mm_store_si128((__m128i *)dst_ptr, srcRegFilt32b1_1);

    dst_ptr += dst_pitch;
  }
}